

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  REF_NODE ref_node;
  REF_ADJ pRVar5;
  REF_CELL pRVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  REF_DBL RVar11;
  REF_DBL RVar12;
  REF_DBL RVar13;
  REF_DBL RVar14;
  REF_DBL RVar15;
  REF_STATUS RVar16;
  uint uVar17;
  void *__ptr;
  REF_GLOB *pRVar18;
  REF_DBL *pRVar19;
  long lVar20;
  REF_DBL *pRVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  undefined8 uVar26;
  REF_INT cell;
  undefined8 *puVar27;
  char *pcVar28;
  int iVar29;
  double dVar30;
  double dVar31;
  uint local_134;
  REF_DBL *local_130;
  REF_DBL m [6];
  REF_INT nodes [27];
  REF_DBL log_m [6];
  
  ref_node = ref_grid->node;
  uVar17 = ref_node->max;
  uVar24 = (ulong)uVar17;
  if ((int)uVar17 < 0) {
    pcVar28 = "malloc backup of REF_DBL negative";
    uVar26 = 0x696;
LAB_001ba5b2:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar26
           ,"ref_metric_imply_non_tet",pcVar28);
    local_134 = 1;
  }
  else {
    __ptr = malloc(uVar24 * 0x30);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x696,"ref_metric_imply_non_tet","malloc backup of REF_DBL NULL");
    }
    else {
      if (uVar24 != 0) {
        pRVar18 = ref_node->global;
        uVar22 = 0;
        do {
          if (-1 < *pRVar18) {
            uVar23 = uVar22 & 0x7fffffff0;
            uVar26 = *(undefined8 *)((long)metric + uVar23);
            uVar7 = ((undefined8 *)((long)metric + uVar23))[1];
            puVar27 = (undefined8 *)((long)metric + uVar23 + 0x10);
            uVar8 = *puVar27;
            uVar9 = puVar27[1];
            puVar27 = (undefined8 *)((long)metric + uVar23 + 0x20);
            uVar10 = puVar27[1];
            puVar2 = (undefined8 *)((long)__ptr + uVar23 + 0x20);
            *puVar2 = *puVar27;
            puVar2[1] = uVar10;
            puVar27 = (undefined8 *)((long)__ptr + uVar23 + 0x10);
            *puVar27 = uVar8;
            puVar27[1] = uVar9;
            *(undefined8 *)((long)__ptr + uVar23) = uVar26;
            ((undefined8 *)((long)__ptr + uVar23))[1] = uVar7;
          }
          uVar22 = uVar22 + 0x30;
          pRVar18 = pRVar18 + 1;
        } while (uVar24 * 0x30 != uVar22);
      }
      pRVar19 = (REF_DBL *)malloc(uVar24 * 8);
      if (pRVar19 == (REF_DBL *)0x0) {
        local_130 = (REF_DBL *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x69b,"ref_metric_imply_non_tet","malloc total_node_volume of REF_DBL NULL");
      }
      else {
        local_130 = pRVar19;
        if (uVar24 != 0) {
          uVar24 = 1;
          if (1 < (int)uVar17) {
            uVar24 = (ulong)uVar17;
          }
          memset(pRVar19,0,uVar24 << 3);
        }
      }
      if (pRVar19 != (REF_DBL *)0x0) {
        iVar29 = ref_node->max;
        if (0 < (long)iVar29) {
          pRVar18 = ref_node->global;
          lVar25 = 0;
          do {
            if ((-1 < pRVar18[lVar25]) &&
               ((((pRVar5 = ref_grid->cell[9]->ref_adj, lVar25 < pRVar5->nnode &&
                  (pRVar5->first[lVar25] != -1)) ||
                 ((pRVar5 = ref_grid->cell[10]->ref_adj, lVar25 < pRVar5->nnode &&
                  (pRVar5->first[lVar25] != -1)))) ||
                ((pRVar5 = ref_grid->cell[0xb]->ref_adj, lVar25 < pRVar5->nnode &&
                 (pRVar5->first[lVar25] != -1)))))) {
              puVar27 = (undefined8 *)((lVar25 * 0x30 & 0x7fffffff0U) + (long)metric);
              puVar27[4] = 0;
              puVar27[5] = 0;
              puVar27[2] = 0;
              puVar27[3] = 0;
              *puVar27 = 0;
              puVar27[1] = 0;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != iVar29);
        }
        pRVar6 = ref_grid->cell[10];
        if (0 < pRVar6->max) {
          iVar29 = 0;
          do {
            RVar16 = ref_cell_nodes(pRVar6,iVar29,nodes);
            if (RVar16 == 0) {
              uVar17 = add_sub_tet(0,4,5,3,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6ae,"ref_metric_imply_non_tet",(ulong)uVar17,"pri sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(0,1,5,4,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6b1,"ref_metric_imply_non_tet",(ulong)uVar17,"pri sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(0,1,2,5,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6b4,"ref_metric_imply_non_tet",(ulong)uVar17,"pri sub tet");
                return uVar17;
              }
            }
            iVar29 = iVar29 + 1;
          } while (iVar29 < pRVar6->max);
        }
        pRVar6 = ref_grid->cell[9];
        if (0 < pRVar6->max) {
          cell = 0;
          do {
            RVar16 = ref_cell_nodes(pRVar6,cell,nodes);
            if (RVar16 == 0) {
              uVar17 = add_sub_tet(0,4,1,2,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6bb,"ref_metric_imply_non_tet",(ulong)uVar17,"pyr sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(0,3,4,2,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6be,"ref_metric_imply_non_tet",(ulong)uVar17,"pyr sub tet");
                return uVar17;
              }
            }
            cell = cell + 1;
          } while (cell < pRVar6->max);
        }
        pRVar6 = ref_grid->cell[0xb];
        if (0 < pRVar6->max) {
          iVar29 = 0;
          do {
            RVar16 = ref_cell_nodes(pRVar6,iVar29,nodes);
            if (RVar16 == 0) {
              uVar17 = add_sub_tet(0,5,7,4,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6ca,"ref_metric_imply_non_tet",(ulong)uVar17,"hex sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(0,1,7,5,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6cd,"ref_metric_imply_non_tet",(ulong)uVar17,"hex sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(1,6,7,5,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6d0,"ref_metric_imply_non_tet",(ulong)uVar17,"hex sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(0,7,2,3,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6d4,"ref_metric_imply_non_tet",(ulong)uVar17,"hex sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(0,7,1,2,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6d7,"ref_metric_imply_non_tet",(ulong)uVar17,"hex sub tet");
                return uVar17;
              }
              uVar17 = add_sub_tet(1,7,6,2,nodes,metric,local_130,ref_node,pRVar6);
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x6da,"ref_metric_imply_non_tet",(ulong)uVar17,"hex sub tet");
                return uVar17;
              }
            }
            iVar29 = iVar29 + 1;
          } while (iVar29 < pRVar6->max);
        }
        if (0 < ref_node->max) {
          lVar25 = 0;
          pRVar19 = metric;
          do {
            if (-1 < ref_node->global[lVar25]) {
              pRVar5 = ref_grid->cell[9]->ref_adj;
              if ((((lVar25 < pRVar5->nnode) && (pRVar5->first[lVar25] != -1)) ||
                  ((pRVar5 = ref_grid->cell[10]->ref_adj, lVar25 < pRVar5->nnode &&
                   (pRVar5->first[lVar25] != -1)))) ||
                 ((pRVar5 = ref_grid->cell[0xb]->ref_adj, lVar25 < pRVar5->nnode &&
                  (pRVar5->first[lVar25] != -1)))) {
                if (ref_node->ref_mpi->id == ref_node->part[lVar25]) {
                  uVar24 = lVar25 * 0x30 & 0x7fffffff0;
                  pRVar1 = (REF_DBL *)((long)metric + uVar24);
                  dVar3 = local_130[lVar25];
                  if (dVar3 <= 0.0) {
                    pRVar21 = (REF_DBL *)(uVar24 + (long)__ptr);
                    RVar11 = *pRVar21;
                    RVar12 = pRVar21[1];
                    RVar13 = pRVar21[2];
                    RVar14 = pRVar21[3];
                    RVar15 = pRVar21[5];
                    pRVar1[4] = pRVar21[4];
                    pRVar1[5] = RVar15;
                    pRVar1[2] = RVar13;
                    pRVar1[3] = RVar14;
                    *pRVar1 = RVar11;
                    pRVar1[1] = RVar12;
                    lVar20 = 0;
                    do {
                      if (0x7fefffffffffffff < (ulong)ABS(pRVar19[lVar20])) {
                        pcVar28 = "backup not finite";
                        uVar26 = 0x6f5;
                        goto LAB_001ba5b2;
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 6);
                  }
                  else {
                    dVar30 = dVar3 * 1e+20;
                    if (dVar30 <= -dVar30) {
                      dVar30 = -dVar30;
                    }
                    lVar20 = 0;
                    do {
                      dVar4 = pRVar19[lVar20];
                      dVar31 = dVar4;
                      if (dVar4 <= -dVar4) {
                        dVar31 = -dVar4;
                      }
                      if (dVar30 <= dVar31) {
                        pcVar28 = "zero volume";
                        local_134 = 4;
                        uVar26 = 0x6e9;
                        uVar24 = 4;
                        goto LAB_001bafb1;
                      }
                      log_m[lVar20] = dVar4 / dVar3;
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 6);
                    uVar17 = ref_matrix_exp_m(log_m,m);
                    if (uVar17 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x6ec,"ref_metric_imply_non_tet",(ulong)uVar17,"exp");
                      return uVar17;
                    }
                    pRVar1[4] = m[4];
                    pRVar1[5] = m[5];
                    pRVar1[2] = m[2];
                    pRVar1[3] = m[3];
                    *pRVar1 = m[0];
                    pRVar1[1] = m[1];
                    local_130[lVar25] = 0.0;
                    lVar20 = 0;
                    do {
                      if (0x7fefffffffffffff < (ulong)ABS(pRVar19[lVar20])) {
                        pcVar28 = "infer not finite";
                        uVar26 = 0x6f0;
                        goto LAB_001ba5b2;
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != 6);
                  }
                }
              }
              else {
                lVar20 = 0;
                do {
                  if (0x7fefffffffffffff < (ulong)ABS(pRVar19[lVar20])) {
                    pcVar28 = "orig,tet not finite";
                    uVar26 = 0x6fa;
                    goto LAB_001ba5b2;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 6);
              }
            }
            lVar25 = lVar25 + 1;
            pRVar19 = pRVar19 + 6;
          } while (lVar25 < ref_node->max);
        }
        if (local_130 != (REF_DBL *)0x0) {
          free(local_130);
        }
        free(__ptr);
        local_134 = ref_node_ghost_dbl(ref_node,metric,6);
        if (local_134 == 0) {
          return 0;
        }
        pcVar28 = "update ghosts";
        uVar26 = 0x701;
        uVar24 = (ulong)local_134;
LAB_001bafb1:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar26,"ref_metric_imply_non_tet",uVar24,pcVar28);
        return local_134;
      }
    }
    local_134 = 2;
  }
  return local_134;
}

Assistant:

REF_FCN REF_STATUS ref_metric_imply_non_tet(REF_DBL *metric,
                                            REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *total_node_volume;
  REF_DBL m[6], log_m[6];
  REF_INT node, im;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *backup;

  ref_malloc(backup, 6 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (im = 0; im < 6; im++) backup[im + 6 * node] = metric[im + 6 * node];
  }

  ref_malloc_init(total_node_volume, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      for (im = 0; im < 6; im++) {
        metric[im + 6 * node] = 0.0;
      }
    }
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 5, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 5, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
    RSS(add_sub_tet(0, 1, 2, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pri sub tet");
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 4, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
    RSS(add_sub_tet(0, 3, 4, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "pyr sub tet");
  }

  /*
VI1 VI6 VI8 VI5  VI1 VI2 VI8 VI6  VI2 VI7 VI8 VI6
VI1 VI8 VI3 VI4  VI1 VI8 VI2 VI3  VI2 VI8 VI7 VI3
  */

  ref_cell = ref_grid_hex(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(add_sub_tet(0, 5, 7, 4, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 1, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 6, 7, 5, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");

    RSS(add_sub_tet(0, 7, 2, 3, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(0, 7, 1, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
    RSS(add_sub_tet(1, 7, 6, 2, nodes, metric, total_node_volume, ref_node,
                    ref_cell),
        "hex sub tet");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pyr(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_pri(ref_grid)), node)) ||
        ref_adj_valid(
            ref_adj_first(ref_cell_adj(ref_grid_hex(ref_grid)), node))) {
      if (ref_node_owned(ref_node, node)) {
        if (0.0 < total_node_volume[node]) {
          for (im = 0; im < 6; im++) {
            if (!ref_math_divisible(metric[im + 6 * node],
                                    total_node_volume[node]))
              RSS(REF_DIV_ZERO, "zero volume");
            log_m[im] = metric[im + 6 * node] / total_node_volume[node];
          }
          RSS(ref_matrix_exp_m(log_m, m), "exp");
          for (im = 0; im < 6; im++) metric[im + 6 * node] = m[im];
          total_node_volume[node] = 0.0;
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "infer not finite");
        } else {
          for (im = 0; im < 6; im++)
            metric[im + 6 * node] = backup[im + 6 * node];
          for (im = 0; im < 6; im++)
            RAS(isfinite(metric[im + 6 * node]), "backup not finite");
        }
      }
    } else {
      for (im = 0; im < 6; im++)
        RAS(isfinite(metric[im + 6 * node]), "orig,tet not finite");
    }
  }

  ref_free(total_node_volume);
  ref_free(backup);

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}